

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O2

t_int * sigczero_rev_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  
  lVar5 = w[1];
  lVar6 = w[2];
  lVar7 = w[3];
  lVar8 = w[4];
  lVar9 = w[5];
  lVar10 = w[6];
  lVar11 = w[7];
  uVar12 = 0;
  uVar13 = (ulong)*(uint *)(w + 8);
  fVar14 = *(float *)(lVar11 + 0x38);
  fVar15 = *(float *)(lVar11 + 0x34);
  if ((int)*(uint *)(w + 8) < 1) {
    uVar13 = uVar12;
  }
  for (; (int)uVar13 != (int)uVar12; uVar12 = uVar12 + 1) {
    fVar1 = *(float *)(lVar5 + uVar12 * 4);
    fVar2 = *(float *)(lVar6 + uVar12 * 4);
    fVar3 = *(float *)(lVar7 + uVar12 * 4);
    fVar4 = *(float *)(lVar8 + uVar12 * 4);
    *(float *)(lVar9 + uVar12 * 4) = (fVar15 - fVar1 * fVar3) - fVar2 * fVar4;
    *(float *)(lVar10 + uVar12 * 4) = fVar3 * fVar2 + (fVar14 - fVar4 * fVar1);
    fVar14 = fVar2;
    fVar15 = fVar1;
  }
  *(float *)(lVar11 + 0x34) = fVar15;
  *(float *)(lVar11 + 0x38) = fVar14;
  return w + 9;
}

Assistant:

static t_int *sigczero_rev_perform(t_int *w)
{
    t_sample *inre1 = (t_sample *)(w[1]);
    t_sample *inim1 = (t_sample *)(w[2]);
    t_sample *inre2 = (t_sample *)(w[3]);
    t_sample *inim2 = (t_sample *)(w[4]);
    t_sample *outre = (t_sample *)(w[5]);
    t_sample *outim = (t_sample *)(w[6]);
    t_sigczero_rev *x = (t_sigczero_rev *)(w[7]);
    int n = (int)w[8];
    int i;
    t_sample lastre = x->x_lastre;
    t_sample lastim = x->x_lastim;
    for (i = 0; i < n; i++)
    {
        t_sample nextre = *inre1++;
        t_sample nextim = *inim1++;
        t_sample coefre = *inre2++;
        t_sample coefim = *inim2++;
            /* transfer function is (A bar) - Z^-1, for the same
            frequency response as 1 - AZ^-1 from czero_tilde. */
        *outre++ = lastre - nextre * coefre - nextim * coefim;
        *outim++ = lastim - nextre * coefim + nextim * coefre;
        lastre = nextre;
        lastim = nextim;
    }
    x->x_lastre = lastre;
    x->x_lastim = lastim;
    return (w+9);
}